

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_1::AttachmentTextureLayerCase::test
          (AttachmentTextureLayerCase *this)

{
  CallLogWrapper *this_00;
  int layer;
  GLenum GVar1;
  GLenum GVar2;
  GLuint textureID_1;
  GLuint textureID;
  GLuint framebufferID;
  GLuint local_2c;
  GLuint local_28;
  GLuint local_24;
  
  GVar1 = 0;
  local_24 = 0;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGenFramebuffers(this_00,1,&local_24);
  glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,local_24);
  ApiCase::expectError(&this->super_ApiCase,0);
  local_28 = 0;
  glu::CallLogWrapper::glGenTextures(this_00,1,&local_28);
  glu::CallLogWrapper::glBindTexture(this_00,0x806f,local_28);
  glu::CallLogWrapper::glTexStorage3D(this_00,0x806f,1,0x8058,0x10,0x10,0x10);
  do {
    GVar2 = GVar1;
    glu::CallLogWrapper::glFramebufferTextureLayer(this_00,0x8d40,0x8ce0,local_28,0,GVar1);
    checkAttachmentParam
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               0x8ce0,0x8cd4,GVar1,GVar2);
    GVar1 = GVar1 + 1;
  } while (GVar1 != 0x10);
  GVar1 = 0;
  glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,0,0);
  glu::CallLogWrapper::glDeleteTextures(this_00,1,&local_28);
  local_2c = 0;
  glu::CallLogWrapper::glGenTextures(this_00,1,&local_2c);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,local_2c);
  glu::CallLogWrapper::glTexStorage3D(this_00,0x8c1a,1,0x8058,0x10,0x10,0x10);
  do {
    GVar2 = GVar1;
    glu::CallLogWrapper::glFramebufferTextureLayer(this_00,0x8d40,0x8ce0,local_2c,0,GVar1);
    checkAttachmentParam
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               0x8ce0,0x8cd4,GVar1,GVar2);
    GVar1 = GVar1 + 1;
  } while (GVar1 != 0x10);
  glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,0,0);
  glu::CallLogWrapper::glDeleteTextures(this_00,1,&local_2c);
  glu::CallLogWrapper::glDeleteFramebuffers(this_00,1,&local_24);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		GLuint framebufferID = 0;
		glGenFramebuffers(1, &framebufferID);
		glBindFramebuffer(GL_FRAMEBUFFER, framebufferID);
		expectError(GL_NO_ERROR);

		// tex3d
		{
			GLuint textureID = 0;
			glGenTextures(1, &textureID);
			glBindTexture(GL_TEXTURE_3D, textureID);
			glTexStorage3D(GL_TEXTURE_3D, 1, GL_RGBA8, 16, 16, 16);

			for (int layer = 0; layer < 16; ++layer)
			{
				glFramebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, textureID, 0, layer);
				checkColorAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LAYER, layer);
			}

			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0, 0);
			glDeleteTextures(1, &textureID);
		}
		// tex2d array
		{
			GLuint textureID = 0;
			glGenTextures(1, &textureID);
			glBindTexture(GL_TEXTURE_2D_ARRAY, textureID);
			glTexStorage3D(GL_TEXTURE_2D_ARRAY, 1, GL_RGBA8, 16, 16, 16);

			for (int layer = 0; layer < 16; ++layer)
			{
				glFramebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, textureID, 0, layer);
				checkColorAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LAYER, layer);
			}

			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0, 0);
			glDeleteTextures(1, &textureID);
		}

		glDeleteFramebuffers(1, &framebufferID);
		expectError(GL_NO_ERROR);
	}